

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaOP.cpp
# Opt level: O3

void __thiscall
OmegaOP::OmegaOP(OmegaOP *this,vector<double,_std::allocator<double>_> *values,double firstdata,
                double beta,uint n)

{
  pointer pdVar1;
  uint **ppuVar2;
  double *pdVar3;
  double *pdVar4;
  double **ppdVar5;
  uint **ppuVar6;
  uint *puVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint i;
  long lVar11;
  ulong uVar12;
  double dVar13;
  
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  pdVar1 = (values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(values->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pdVar1;
  uVar12 = uVar10 & 0x7fffffff8;
  uVar10 = uVar10 >> 3;
  uVar9 = (uint)uVar10;
  this->nbStates = uVar9;
  pdVar4 = (double *)operator_new__(uVar12);
  this->states = pdVar4;
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      pdVar4[uVar8] = pdVar1[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uVar10 & 0xffffffff) != uVar8);
  }
  ppdVar5 = (double **)operator_new__(0x18);
  this->S12P = ppdVar5;
  ppdVar5 = (double **)operator_new__(uVar12);
  this->Q = ppdVar5;
  ppuVar6 = (uint **)operator_new__(uVar12);
  this->lastChpt = ppuVar6;
  ppuVar6 = (uint **)operator_new__(uVar12);
  this->lastIndState = ppuVar6;
  uVar12 = (ulong)(n + 1) * 8;
  lVar11 = 0;
  do {
    pdVar4 = (double *)operator_new__(uVar12);
    this->S12P[lVar11] = pdVar4;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 3);
  if (uVar9 != 0) {
    uVar8 = 0;
    do {
      pdVar4 = (double *)operator_new__(uVar12);
      this->Q[uVar8] = pdVar4;
      uVar8 = uVar8 + 1;
    } while ((uVar10 & 0xffffffff) != uVar8);
    if (uVar9 != 0) {
      uVar12 = (ulong)(n + 1) << 2;
      uVar8 = 0;
      do {
        puVar7 = (uint *)operator_new__(uVar12);
        this->lastChpt[uVar8] = puVar7;
        uVar8 = uVar8 + 1;
      } while ((uVar10 & 0xffffffff) != uVar8);
      if (uVar9 != 0) {
        uVar8 = 0;
        do {
          puVar7 = (uint *)operator_new__(uVar12);
          this->lastIndState[uVar8] = puVar7;
          uVar8 = uVar8 + 1;
        } while ((uVar10 & 0xffffffff) != uVar8);
        if (uVar9 != 0) {
          pdVar4 = this->states;
          ppdVar5 = this->Q;
          ppuVar6 = this->lastIndState;
          ppuVar2 = this->lastChpt;
          uVar10 = 0;
          do {
            pdVar3 = ppdVar5[uVar10];
            *pdVar3 = 0.0;
            dVar13 = firstdata - pdVar4[uVar10];
            pdVar3[1] = dVar13 * dVar13;
            puVar7 = ppuVar6[uVar10];
            *puVar7 = (uint)uVar10;
            puVar7[1] = (uint)uVar10;
            puVar7 = ppuVar2[uVar10];
            puVar7[0] = 0;
            puVar7[1] = 1;
            uVar10 = uVar10 + 1;
          } while (uVar10 < this->nbStates);
        }
      }
    }
  }
  this->penalty = beta;
  return;
}

Assistant:

OmegaOP::OmegaOP(std::vector< double >& values, double firstdata, double beta, unsigned int n)
{
  nbStates = values.size();
  states = new double[nbStates];
  for(unsigned int i = 0; i < nbStates; i++){states[i] = values[i];}

  /// MATRIX INITIALIZATION
  S12P = new double*[3]; ///matrix of vectors S1, S2 and SP
  Q = new double*[nbStates]; ///matrix of costs
  lastChpt = new unsigned int*[nbStates]; ///matrix of best last changepoints
  lastIndState = new unsigned int*[nbStates]; ///matrix of starting states for the best last segment

  for(unsigned int i = 0; i < 3; i++){S12P[i] = new double[n + 1];}
  for(unsigned int i = 0; i < nbStates; i++){Q[i] = new double[n + 1];}
  for(unsigned int i = 0; i < nbStates; i++){lastChpt[i] = new unsigned int[n + 1];}
  for(unsigned int i = 0; i < nbStates; i++){lastIndState[i] = new unsigned int[n + 1];}

  /// FILL FIRST COLUMN in Q, lastIndState,lastChpt
  for(unsigned int i = 0; i < nbStates; i++)
  {
    Q[i][0] = 0;
    Q[i][1] = (firstdata - states[i])*(firstdata - states[i]);
    lastIndState[i][0] = i;
    lastIndState[i][1] = i;
    lastChpt[i][0] = 0;
    lastChpt[i][1] = 1;
  }
  penalty = beta;
}